

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O0

void double_suite::test_same(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  double absolute_tolerance;
  double *in_stack_fffffffffffffea8;
  double local_140;
  value_type local_138;
  undefined4 local_12c;
  size_type local_128 [2];
  size_type local_118;
  double local_108;
  value_type local_100;
  undefined4 local_f4;
  size_type local_f0 [2];
  size_type local_e0;
  double local_d0;
  value_type local_c8;
  undefined4 local_bc;
  size_type local_b8 [2];
  size_type local_a8;
  double local_98;
  value_type local_90;
  undefined4 local_84;
  size_type local_80 [2];
  size_type local_70;
  double local_60;
  value_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  trend<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.grand.member.count,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::basic_trend
            ((basic_trend<double,_(trial::online::with)1> *)local_38);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_48[0] = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::size
                          ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_4c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x23,"void double_suite::test_same()",local_48,&local_4c);
  local_58 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_60 = 1.0;
  local_70 = filter.grand.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x24,0x1062c4,(char *)&local_58,&local_60,in_stack_fffffffffffffea8,
             predicate_03);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_80[0] = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::size
                          ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_84 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x26,"void double_suite::test_same()",local_80,&local_84);
  local_90 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_98 = 1.0;
  local_a8 = filter.grand.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x27,0x1062c4,(char *)&local_90,&local_98,in_stack_fffffffffffffea8,
             predicate_02);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_b8[0] = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::size
                          ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_bc = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x29,"void double_suite::test_same()",local_b8,&local_bc);
  local_c8 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_d0 = 1.0;
  local_e0 = filter.grand.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x2a,0x1062c4,(char *)&local_c8,&local_d0,in_stack_fffffffffffffea8,
             predicate_01);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_f0[0] = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::size
                          ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_f4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x2c,"void double_suite::test_same()",local_f0,&local_f4);
  local_100 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_108 = 1.0;
  local_118 = filter.grand.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x2d,0x1062c4,(char *)&local_100,&local_108,in_stack_fffffffffffffea8,
             predicate_00);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_128[0] = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::size
                           ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_12c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,0x2f,"void double_suite::test_same()",local_128,&local_12c);
  local_138 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_140 = 1.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x30,0x1062c4,(char *)&local_138,&local_140,in_stack_fffffffffffffea8,
             predicate);
  return;
}

Assistant:

void test_same()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 2);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 3);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 4);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.size(), 5);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
}